

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

void Gia_ManCheckResub(Vec_Ptr_t *vDivs,int nWords)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  void *__s;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int pVarSet [10];
  int local_58 [10];
  
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[0] = 2;
  local_58[1] = 3;
  local_58[2] = 4;
  local_58[3] = 0;
  if ((0 < vDivs->nSize) && (vDivs->nSize != 1)) {
    pvVar2 = *vDivs->pArray;
    pvVar3 = vDivs->pArray[1];
    __s = malloc(0x100);
    if (__s != (void *)0x0) {
      memset(__s,0xff,0x100);
    }
    puts("Verifying resub:");
    if (0 < nWords) {
      uVar4 = nWords * 0x40;
      if (nWords * 0x40 < 2) {
        uVar4 = 1;
      }
      uVar10 = 0;
      do {
        uVar5 = (ulong)(uint)((int)(uVar10 >> 6) * 8);
        uVar9 = (uint)((*(ulong *)((long)pvVar3 + uVar5) >> (uVar10 & 0x3f) & 1) != 0);
        if (((*(ulong *)((long)pvVar2 + uVar5) >> (uVar10 & 0x3f) & 1) != 0) || (uVar9 != 0)) {
          lVar6 = 0;
          uVar7 = 0;
          do {
            iVar1 = local_58[lVar6];
            if (((long)iVar1 < 0) || (vDivs->nSize <= iVar1)) goto LAB_007aa4d6;
            uVar8 = 1 << ((byte)lVar6 & 0x1f);
            if ((*(ulong *)((long)vDivs->pArray[iVar1] + (uVar10 >> 6) * 8) &
                1L << ((byte)uVar10 & 0x3f)) == 0) {
              uVar8 = 0;
            }
            uVar7 = uVar7 | uVar8;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 3);
          if (0x3f < uVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar8 = *(uint *)((long)__s + (ulong)uVar7 * 4);
          if (uVar8 == 0xffffffff) {
            *(uint *)((long)__s + (ulong)uVar7 * 4) = uVar9;
          }
          else if (uVar8 != uVar9) {
            printf("Mismatch in pattern %d\n",uVar10);
          }
        }
        uVar9 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar9;
      } while (uVar9 != uVar4);
    }
    puts("Finished verifying resub.");
    if (__s != (void *)0x0) {
      free(__s);
      return;
    }
    return;
  }
LAB_007aa4d6:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Gia_ManCheckResub( Vec_Ptr_t * vDivs, int nWords )
{
    //int i, nVars = 6, pVarSet[10] = { 2, 189, 2127, 2125, 177, 178 };
    int i, nVars = 3, pVarSet[10] = { 2, 3, 4 };
    word * pOff = (word *)Vec_PtrEntry( vDivs, 0 );
    word * pOn  = (word *)Vec_PtrEntry( vDivs, 1 );
    Vec_Int_t * vValue = Vec_IntStartFull( 1 << 6 );
    printf( "Verifying resub:\n" );
    for ( i = 0; i < 64*nWords; i++ )
    {
        int v, Mint = 0, Value = Abc_TtGetBit(pOn, i);
        if ( !Abc_TtGetBit(pOff, i) && !Value )
            continue;
        for ( v = 0; v < nVars; v++ )
            if ( Abc_TtGetBit((word *)Vec_PtrEntry(vDivs, pVarSet[v]), i) )
                Mint |= 1 << v;
        if ( Vec_IntEntry(vValue, Mint) == -1 )
            Vec_IntWriteEntry(vValue, Mint, Value);
        else if ( Vec_IntEntry(vValue, Mint) != Value )
            printf( "Mismatch in pattern %d\n", i );
    }
    printf( "Finished verifying resub.\n" );
    Vec_IntFree( vValue );
}